

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

GuessScore __thiscall
csv::internals::calculate_score(internals *this,string_view head,CSVFormat *format)

{
  size_type sVar1;
  reference pCVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  long lVar5;
  mapped_type mVar6;
  __node_base *p_Var7;
  size_t i;
  ulong __n;
  undefined1 auVar8 [16];
  double dVar9;
  GuessScore GVar10;
  unsigned_long row_size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a20;
  double local_a18;
  double dStack_a10;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  row_when;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  row_tally;
  RowCollection rows;
  stringstream source;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parser;
  
  parser.super_IBasicCSVParser._vptr_IBasicCSVParser = (_func_int **)0x0;
  parser.super_IBasicCSVParser.current_row.data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_long_const,unsigned_long>const*>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&row_tally,&parser,
             &parser.super_IBasicCSVParser.current_row.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,0,&source,&rows,&row_when);
  parser.super_IBasicCSVParser._vptr_IBasicCSVParser = (_func_int **)0x0;
  parser.super_IBasicCSVParser.current_row.data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_long_const,unsigned_long>const*>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&row_when,&parser,
             &parser.super_IBasicCSVParser.current_row.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,0,&source,&rows,&row_size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,(char *)head._M_len,(allocator<char> *)&rows);
  std::__cxx11::stringstream::stringstream((stringstream *)&source,(string *)&parser,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&parser);
  ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(&rows,100);
  row_size = 0;
  _Stack_a20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StreamParser(&parser,&source,(CSVFormat *)head._M_str,(ColNamesPtr *)&row_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a20);
  parser.super_IBasicCSVParser._records = &rows;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::next(&parser,10000000);
  __n = 0;
  while( true ) {
    sVar1 = std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::size(&rows.data);
    if (sVar1 <= __n) break;
    pCVar2 = std::_Deque_iterator<csv::CSVRow,_csv::CSVRow_&,_csv::CSVRow_*>::operator[]
                       (&rows.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>.
                         _M_impl.super__Deque_impl_data._M_start,__n);
    if (pCVar2->row_length != 0) {
      row_size = pCVar2->row_length;
      iVar3 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&row_tally._M_h,&row_size);
      if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
          _M_cur == (__node_type *)0x0) {
        row_size = pCVar2->row_length;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&row_tally._M_h,&row_size);
        *pmVar4 = 1;
        row_size = pCVar2->row_length;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&row_when,&row_size);
        *pmVar4 = __n;
      }
      else {
        row_size = pCVar2->row_length;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&row_tally._M_h,&row_size);
        *pmVar4 = *pmVar4 + 1;
      }
    }
    __n = __n + 1;
  }
  local_a18 = 0.0;
  p_Var7 = &row_tally._M_h._M_before_begin;
  mVar6 = 0;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    row_size = *(unsigned_long *)(p_Var7 + 1);
    lVar5 = row_size *
            (long)*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
    auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = 0x45300000;
    dStack_a10 = auVar8._8_8_ - 1.9342813113834067e+25;
    dVar9 = dStack_a10 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    if (local_a18 < dVar9) {
      local_a18 = dVar9;
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&row_when,&row_size);
      mVar6 = *pmVar4;
    }
  }
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~StreamParser(&parser);
  ThreadSafeDeque<csv::CSVRow>::~ThreadSafeDeque(&rows);
  std::__cxx11::stringstream::~stringstream((stringstream *)&source);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&row_when._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&row_tally._M_h);
  GVar10.header = mVar6;
  GVar10.score = local_a18;
  return GVar10;
}

Assistant:

CSV_INLINE GuessScore calculate_score(csv::string_view head, const CSVFormat& format) {
            // Frequency counter of row length
            std::unordered_map<size_t, size_t> row_tally = { { 0, 0 } };

            // Map row lengths to row num where they first occurred
            std::unordered_map<size_t, size_t> row_when = { { 0, 0 } };

            // Parse the CSV
            std::stringstream source(head.data());
            RowCollection rows;

            StreamParser<std::stringstream> parser(source, format);
            parser.set_output(rows);
            parser.next();

            for (size_t i = 0; i < rows.size(); i++) {
                auto& row = rows[i];

                // Ignore zero-length rows
                if (row.size() > 0) {
                    if (row_tally.find(row.size()) != row_tally.end()) {
                        row_tally[row.size()]++;
                    }
                    else {
                        row_tally[row.size()] = 1;
                        row_when[row.size()] = i;
                    }
                }
            }

            double final_score = 0;
            size_t header_row = 0;

            // Final score is equal to the largest
            // row size times rows of that size
            for (auto& pair : row_tally) {
                auto row_size = pair.first;
                auto row_count = pair.second;
                double score = (double)(row_size * row_count);
                if (score > final_score) {
                    final_score = score;
                    header_row = row_when[row_size];
                }
            }

            return {
                final_score,
                header_row
            };
        }